

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O2

void fstk_RunFor(char *symName,int32_t start,int32_t stop,int32_t step,int32_t reptLineNo,char *body
                ,size_t size)

{
  Context *pCVar1;
  bool bVar2;
  Symbol *pSVar3;
  char *pcVar4;
  int *piVar5;
  uint32_t uVar6;
  
  pSVar3 = sym_AddVar(symName,start);
  if (pSVar3->type != SYM_VAR) {
    return;
  }
  if (start < stop && 0 < step) {
    uVar6 = (int)(((long)~start + (long)stop) / (long)(ulong)(uint)step) + 1;
LAB_0010b8a0:
    if (start <= stop || step < 1) goto LAB_0010b8af;
  }
  else {
    if (start <= stop || -1 < step) {
      uVar6 = 0;
      if (step == 0) {
        error("FOR cannot have a step value of 0\n");
        return;
      }
      goto LAB_0010b8a0;
    }
    uVar6 = (int)(((long)~stop + (long)start) / -(long)step) + 1;
LAB_0010b8af:
    if (-1 < step || stop <= start) goto LAB_0010b8d7;
  }
  warning(WARNING_BACKWARDS_FOR,"FOR goes backwards from %d to %d by %d\n",start,(ulong)(uint)stop,
          (ulong)(uint)step);
LAB_0010b8d7:
  if ((uVar6 != 0) && (bVar2 = newReptContext(reptLineNo,body,size), pCVar1 = contextStack, bVar2))
  {
    contextStack->nbReptIters = uVar6;
    pCVar1->forValue = start;
    pCVar1->forStep = step;
    pcVar4 = strdup(symName);
    pCVar1->forName = pcVar4;
    if (pcVar4 == (char *)0x0) {
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      fatalerror("Not enough memory for FOR symbol name: %s\n",pcVar4);
    }
  }
  return;
}

Assistant:

void fstk_RunFor(char const *symName, int32_t start, int32_t stop, int32_t step,
		     int32_t reptLineNo, char *body, size_t size)
{
	struct Symbol *sym = sym_AddVar(symName, start);

	if (sym->type != SYM_VAR)
		return;

	uint32_t count = 0;

	if (step > 0 && start < stop)
		count = ((int64_t)stop - start - 1) / step + 1;
	else if (step < 0 && stop < start)
		count = ((int64_t)start - stop - 1) / -(int64_t)step + 1;
	else if (step == 0)
		error("FOR cannot have a step value of 0\n");

	if ((step > 0 && start > stop) || (step < 0 && start < stop))
		warning(WARNING_BACKWARDS_FOR, "FOR goes backwards from %d to %d by %d\n",
			start, stop, step);

	if (count == 0)
		return;
	if (!newReptContext(reptLineNo, body, size))
		return;

	contextStack->nbReptIters = count;
	contextStack->forValue = start;
	contextStack->forStep = step;
	contextStack->forName = strdup(symName);
	if (!contextStack->forName)
		fatalerror("Not enough memory for FOR symbol name: %s\n", strerror(errno));
}